

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O3

void usage(void)

{
  puts(
      "Tests for basic m256v functionality.\n\nThis excludes tests of LU related functions, for which\nthere is a separate utility.\n\n  -h   Display this help screen.\n"
      );
  return;
}

Assistant:

static void usage()
{
	puts(	"Tests for basic m256v functionality.\n"
		"\n"
		"This excludes tests of LU related functions, for which\n"
		"there is a separate utility.\n"
		"\n"
		"  -h   Display this help screen.\n"
		);
}